

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Any_data *__dest;
  char *pcVar1;
  uint64_t uVar2;
  unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> uVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  ostream *this;
  long *plVar8;
  size_t sVar9;
  undefined8 uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 local_340 [8];
  Server srv;
  TSpellCorrector corrector;
  sockaddr_in sin;
  string modelFile;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  char *local_58;
  string hostname;
  
  if (argc != 4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1716d8);
    }
    else {
      sVar9 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," model.bin localhost 8080\n",0x1a);
    return 0x2a;
  }
  std::__cxx11::string::string((string *)sin.sin_zero,argv[1],(allocator *)&srv.running_threads_);
  std::__cxx11::string::string((string *)&local_58,argv[2],(allocator *)&srv.running_threads_);
  std::__cxx11::string::string
            ((string *)&srv.running_threads_,argv[3],(allocator *)&corrector.MaxCandiatesToCheck);
  uVar10 = srv._272_8_;
  piVar6 = __errno_location();
  iVar5 = *piVar6;
  *piVar6 = 0;
  uVar7 = strtol((char *)uVar10,(char **)local_340,10);
  if (local_340 == (undefined1  [8])uVar10) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    uVar11 = (uint)uVar7;
    if (((long)(int)uVar11 == uVar7) && (*piVar6 != 0x22)) {
      if (*piVar6 == 0) {
        *piVar6 = iVar5;
      }
      if ((TWordId *)srv._272_8_ != &corrector.LangModel.UnknownWordId) {
        operator_delete((void *)srv._272_8_);
      }
      NJamSpell::TLangModel::TLangModel((TLangModel *)&srv.running_threads_);
      corrector.LangModel.CheckSum = 0;
      corrector.Deletes1._M_t.
      super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>.
      _M_t.
      super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
      .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
           (__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
            )(__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
              )0x0;
      corrector.Deletes2._M_t.
      super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>.
      _M_t.
      super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
      .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
           (__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
            )(__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
              )0x4034000000000000;
      corrector.KnownWordsPenalty = 5.0;
      corrector.UnknownWordsPenalty = 6.91691904177745e-323;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] loading model",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      piVar6 = &srv.running_threads_;
      bVar4 = NJamSpell::TSpellCorrector::LoadLangModel
                        ((TSpellCorrector *)piVar6,(string *)sin.sin_zero);
      if (bVar4) {
        srv._8_8_ = &srv.base_dir_._M_string_length;
        local_340 = (undefined1  [8])&PTR__Server_0016e3d0;
        srv._vptr_Server._0_1_ = 0;
        srv._vptr_Server._4_4_ = -1;
        srv.base_dir_._M_dataplus._M_p = (pointer)0x0;
        srv.base_dir_._M_string_length._0_1_ = 0;
        memset((void *)((long)&srv.base_dir_.field_2 + 8),0,0xe4);
        signal(0xd,(__sighandler_t)0x1);
        modelFile.field_2._8_8_ = piVar6;
        httplib::Server::Get((Server *)local_340,"/fix",(Handler *)((long)&modelFile.field_2 + 8));
        __dest = (_Any_data *)((long)&modelFile.field_2 + 8);
        std::
        _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/web_server/main.cpp:73:21)>
        ::_M_manager(__dest,__dest,__destroy_functor);
        local_b8._8_8_ = 0;
        pcStack_a0 = std::
                     _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/web_server/main.cpp:77:22)>
                     ::_M_invoke;
        local_a8 = std::
                   _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/web_server/main.cpp:77:22)>
                   ::_M_manager;
        local_b8._M_unused._M_object = piVar6;
        httplib::Server::Post((Server *)local_340,"/fix",(Handler *)&local_b8);
        if (local_a8 != (code *)0x0) {
          (*local_a8)(&local_b8,&local_b8,__destroy_functor);
        }
        local_98._8_8_ = 0;
        pcStack_80 = std::
                     _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/web_server/main.cpp:81:28)>
                     ::_M_invoke;
        local_88 = std::
                   _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/web_server/main.cpp:81:28)>
                   ::_M_manager;
        local_98._M_unused._M_object = piVar6;
        httplib::Server::Get((Server *)local_340,"/candidates",(Handler *)&local_98);
        if (local_88 != (code *)0x0) {
          (*local_88)(&local_98,&local_98,__destroy_functor);
        }
        local_78._8_8_ = 0;
        pcStack_60 = std::
                     _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/web_server/main.cpp:85:29)>
                     ::_M_invoke;
        local_68 = std::
                   _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/web_server/main.cpp:85:29)>
                   ::_M_manager;
        local_78._M_unused._M_object = piVar6;
        httplib::Server::Post((Server *)local_340,"/candidates",(Handler *)&local_78);
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,__destroy_functor);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"[info] starting web server at ",0x1e);
        this = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_58,(long)hostname._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(this,":",1);
        plVar8 = (long *)std::ostream::operator<<(this,uVar11);
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
        std::ostream::put((char)plVar8);
        std::ostream::flush();
        pcVar1 = local_58;
        iVar5 = (**(_func_int **)((long)local_340 + 0x10))();
        uVar12 = 0xffffffff;
        if ((((char)iVar5 != '\0') &&
            (srv._vptr_Server._4_4_ =
                  httplib::detail::
                  create_socket<httplib::Server::create_server_socket(char_const*,int,int)const::_lambda(int,addrinfo&)_1_>
                            (pcVar1,uVar7 & 0xffffffff,0), srv._vptr_Server._4_4_ != -1)) &&
           (uVar12 = uVar11, uVar11 == 0)) {
          hostname.field_2._12_4_ = 0x10;
          iVar5 = getsockname(srv._vptr_Server._4_4_,(sockaddr *)&corrector.MaxCandiatesToCheck,
                              (socklen_t *)(hostname.field_2._M_local_buf + 0xc));
          uVar12 = (uint)(ushort)(corrector.MaxCandiatesToCheck._2_2_ << 8 |
                                 corrector.MaxCandiatesToCheck._2_2_ >> 8);
          if (iVar5 == -1) {
            uVar12 = 0xffffffff;
          }
        }
        if (-1 < (int)uVar12) {
          httplib::Server::listen_internal((Server *)local_340);
        }
        httplib::Server::~Server((Server *)local_340);
        iVar5 = 0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"[error] failed to load model",0x1c);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
        std::ostream::put(-0x28);
        iVar5 = 0x2a;
        std::ostream::flush();
      }
      uVar3._M_t.
      super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>.
      _M_t.
      super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
      .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
           corrector.Deletes1._M_t.
           super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
           ._M_t.
           super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
           .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl;
      if ((__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>)
          corrector.Deletes1._M_t.
          super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
          .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>)
          0x0) {
        NJamSpell::TBloomFilter::~TBloomFilter
                  ((TBloomFilter *)
                   corrector.Deletes1._M_t.
                   super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                   .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl);
        operator_delete((void *)uVar3._M_t.
                                super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                                .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>.
                                _M_head_impl);
      }
      uVar2 = corrector.LangModel.CheckSum;
      corrector.Deletes1._M_t.
      super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>.
      _M_t.
      super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
      .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
           (__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
            )(__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
              )0x0;
      if (corrector.LangModel.CheckSum != 0) {
        NJamSpell::TBloomFilter::~TBloomFilter((TBloomFilter *)corrector.LangModel.CheckSum);
        operator_delete((void *)uVar2);
      }
      corrector.LangModel.CheckSum = 0;
      srv._272_8_ = &PTR_Dump_0016e478;
      NJamSpell::TPerfectHash::~TPerfectHash
                ((TPerfectHash *)
                 &corrector.LangModel.Buckets.
                  super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (corrector.LangModel.Tokenizer._64_8_ != 0) {
        operator_delete((void *)corrector.LangModel.Tokenizer._64_8_);
      }
      corrector.LangModel._128_8_ = &PTR_Dump_0016e500;
      std::locale::~locale((locale *)&corrector.LangModel.Tokenizer.Alphabet._M_h._M_single_bucket);
      std::
      _Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&corrector.LangModel.Tokenizer);
      if (corrector.LangModel.WordToId.
          super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
          .m_ht._56_8_ != 0) {
        operator_delete((void *)corrector.LangModel.WordToId.
                                super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                .m_ht._56_8_);
      }
      std::
      vector<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
      ::~vector((vector<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
                 *)&corrector.LangModel.WordToId.
                    super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               );
      if ((size_type *)local_58 != &hostname._M_string_length) {
        operator_delete(local_58);
      }
      if (sin.sin_zero == (uchar  [8])&modelFile._M_string_length) {
        return iVar5;
      }
      operator_delete((void *)sin.sin_zero);
      return iVar5;
    }
  }
  uVar10 = std::__throw_out_of_range("stoi");
  __clang_call_terminate(uVar10);
}

Assistant:

int main(int argc, const char** argv) {
    if (argc != 4) {
        std::cerr << "Usage: " << argv[0] << " model.bin localhost 8080\n";
        return 42;
    }

    std::string modelFile = argv[1];
    std::string hostname = argv[2];
    int port = std::stoi(argv[3]);

    NJamSpell::TSpellCorrector corrector;
    std::cerr << "[info] loading model" << std::endl;
    if (!corrector.LoadLangModel(modelFile)) {
        std::cerr << "[error] failed to load model" << std::endl;
        return 42;
    }

    httplib::Server srv;
    srv.Get("/fix", [&corrector](const httplib::Request& req, httplib::Response& resp) {
        resp.set_content(FixText(corrector, req.get_param_value("text")) + "\n", "text/plain");
    });

    srv.Post("/fix", [&corrector](const httplib::Request& req, httplib::Response& resp) {
        resp.set_content(FixText(corrector, req.body) + "\n", "text/plain");
    });

    srv.Get("/candidates", [&corrector](const httplib::Request& req, httplib::Response& resp) {
        resp.set_content(GetCandidates(corrector, req.get_param_value("text")) + "\n", "text/plain");
    });

    srv.Post("/candidates", [&corrector](const httplib::Request& req, httplib::Response& resp) {
        resp.set_content(GetCandidates(corrector, req.body) + "\n", "text/plain");
    });

    std::cerr << "[info] starting web server at " << hostname << ":" << port << std::endl;
    srv.listen(hostname.c_str(), port);
    return 0;
}